

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void clearvalues(global_State *g,GCObject *l,GCObject *f)

{
  byte bVar1;
  global_State *pgVar2;
  TValue *pTVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  global_State *o;
  Table *h;
  
  if (l != f) {
    do {
      bVar1 = (l->h).lsizenode;
      pgVar2 = (l->th).l_G;
      o = pgVar2;
      if (0 < (l->h).sizearray) {
        lVar6 = 0;
        lVar5 = 0;
        do {
          pTVar3 = (l->h).array;
          iVar4 = iscleared(g,(TValue *)((long)&pTVar3->value_ + lVar6));
          if (iVar4 != 0) {
            *(undefined4 *)((long)&pTVar3->tt_ + lVar6) = 0;
          }
          lVar5 = lVar5 + 1;
          lVar6 = lVar6 + 0x10;
        } while (lVar5 < (l->h).sizearray);
        o = (l->th).l_G;
      }
      for (; o < (global_State *)(&pgVar2->frealloc + (long)(1 << (bVar1 & 0x1f)) * 5);
          o = (global_State *)&o->GCestimate) {
        if ((((*(int *)&o->ud != 0) && (iVar4 = iscleared(g,(TValue *)o), iVar4 != 0)) &&
            (*(undefined4 *)&o->ud = 0, (o->GCdebt & 0x40) != 0)) &&
           ((*(byte *)(o->totalbytes + 9) & 3) != 0)) {
          *(undefined4 *)&o->GCdebt = 0xb;
        }
      }
      l = (l->h).gclist;
    } while (l != f);
  }
  return;
}

Assistant:

static void clearvalues (global_State *g, GCObject *l, GCObject *f) {
  for (; l != f; l = gco2t(l)->gclist) {
    Table *h = gco2t(l);
    Node *n, *limit = gnodelast(h);
    int i;
    for (i = 0; i < h->sizearray; i++) {
      TValue *o = &h->array[i];
      if (iscleared(g, o))  /* value was collected? */
        setnilvalue(o);  /* remove value */
    }
    for (n = gnode(h, 0); n < limit; n++) {
      if (!ttisnil(gval(n)) && iscleared(g, gval(n))) {
        setnilvalue(gval(n));  /* remove value ... */
        removeentry(n);  /* and remove entry from table */
      }
    }
  }
}